

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtbdd.c
# Opt level: O3

Abc_Ntk_t * Abc_NtkBddToMuxes(Abc_Ntk_t *pNtk,int fGlobal,int Limit)

{
  int iVar1;
  long *plVar2;
  int *piVar3;
  long lVar4;
  int iVar5;
  Abc_Ntk_t *pNtkNew;
  DdManager *pDVar6;
  st__table *psVar7;
  DdNode *pDVar8;
  void *__ptr;
  undefined8 uVar9;
  Abc_Obj_t *pAVar10;
  Vec_Ptr_t *pVVar11;
  ProgressBar *p;
  int iVar12;
  ulong uVar13;
  char *pcVar14;
  long lVar15;
  long lVar16;
  
  pNtkNew = Abc_NtkStartFrom(pNtk,ABC_NTK_LOGIC,ABC_FUNC_SOP);
  if (fGlobal == 0) {
    if ((pNtk->ntkFunc != ABC_FUNC_BDD) || (pNtk->ntkType != ABC_NTK_LOGIC)) {
      __assert_fail("Abc_NtkIsBddLogic(pNtk)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcNtbdd.c"
                    ,0xb0,"void Abc_NtkBddToMuxesPerform(Abc_Ntk_t *, Abc_Ntk_t *)");
    }
    pVVar11 = Abc_NtkDfs(pNtk,0);
    p = Extra_ProgressBarStart(_stdout,pVVar11->nSize);
    if (0 < pVVar11->nSize) {
      lVar16 = 0;
      do {
        plVar2 = (long *)pVVar11->pArray[lVar16];
        if ((p == (ProgressBar *)0x0) || (p->nItemsNext <= lVar16)) {
          Extra_ProgressBarUpdate_int(p,(int)lVar16,(char *)0x0);
        }
        if ((*(uint *)((long)plVar2 + 0x14) & 0xf) != 7) {
          __assert_fail("Abc_ObjIsNode(pNode)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcNtbdd.c"
                        ,0xb8,"void Abc_NtkBddToMuxesPerform(Abc_Ntk_t *, Abc_Ntk_t *)");
        }
        uVar13 = plVar2[7];
        pDVar6 = *(DdManager **)(*plVar2 + 0x100);
        psVar7 = st__init_table(st__ptrcmp,st__ptrhash);
        if (0 < *(int *)((long)plVar2 + 0x1c)) {
          lVar15 = 0;
          do {
            lVar4 = *(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                             (long)*(int *)(plVar2[4] + lVar15 * 4) * 8);
            pDVar8 = Cudd_bddIthVar(pDVar6,(int)lVar15);
            st__insert(psVar7,(char *)pDVar8,*(char **)(lVar4 + 0x40));
            lVar15 = lVar15 + 1;
          } while (lVar15 < *(int *)((long)plVar2 + 0x1c));
        }
        pAVar10 = Abc_NodeBddToMuxes_rec
                            (pDVar6,(DdNode *)(uVar13 & 0xfffffffffffffffe),pNtkNew,psVar7);
        st__free_table(psVar7);
        if ((uVar13 & 1) != 0) {
          pAVar10 = Abc_NtkCreateNodeInv(pNtkNew,pAVar10);
        }
        if (plVar2[8] != 0) {
          __assert_fail("pNode->pCopy == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcNtbdd.c"
                        ,0xbb,"void Abc_NtkBddToMuxesPerform(Abc_Ntk_t *, Abc_Ntk_t *)");
        }
        plVar2[8] = (long)pAVar10;
        lVar16 = lVar16 + 1;
      } while (lVar16 < pVVar11->nSize);
    }
    if (pVVar11->pArray != (void **)0x0) {
      free(pVVar11->pArray);
    }
    free(pVVar11);
    Extra_ProgressBarStop(p);
    Abc_NtkFinalize(pNtk,pNtkNew);
  }
  else {
    if (pNtk->ntkType != ABC_NTK_STRASH) {
      __assert_fail("Abc_NtkIsStrash(pNtk)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcNtbdd.c"
                    ,0x111,"int Abc_NtkBddToMuxesPerformGlo(Abc_Ntk_t *, Abc_Ntk_t *, int)");
    }
    pDVar6 = (DdManager *)Abc_NtkBuildGlobalBdds(pNtk,Limit,1,1,0,0);
    if (pDVar6 == (DdManager *)0x0) {
      pcVar14 = "Construction of global BDDs has failed.";
      goto LAB_002e60dd;
    }
    psVar7 = st__init_table(st__ptrcmp,st__ptrhash);
    pVVar11 = pNtkNew->vCis;
    if (0 < pVVar11->nSize) {
      lVar16 = 0;
      do {
        pcVar14 = (char *)pVVar11->pArray[lVar16];
        pDVar8 = Cudd_bddIthVar(pDVar6,(int)lVar16);
        st__insert(psVar7,(char *)pDVar8,pcVar14);
        lVar16 = lVar16 + 1;
        pVVar11 = pNtkNew->vCis;
      } while (lVar16 < pVVar11->nSize);
    }
    pVVar11 = pNtk->vCos;
    if (0 < pVVar11->nSize) {
      lVar16 = 0;
      do {
        plVar2 = (long *)pVVar11->pArray[lVar16];
        if (*(int *)(*(long *)(*plVar2 + 0x1b0) + 4) < 8) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        piVar3 = *(int **)(*(long *)(*(long *)(*plVar2 + 0x1b0) + 8) + 0x38);
        __ptr = *(void **)(piVar3 + 2);
        if (__ptr == (void *)0x0) {
          __assert_fail("p->pArrayPtr",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecAtt.h"
                        ,0xf9,"void *Vec_AttEntry(Vec_Att_t *, int)");
        }
        iVar5 = (int)plVar2[2];
        lVar15 = (long)iVar5;
        iVar1 = *piVar3;
        if (iVar1 <= iVar5) {
          iVar12 = iVar5 + 10;
          if (iVar5 < iVar1 * 2) {
            iVar12 = iVar1 * 2;
          }
          if (iVar1 < iVar12) {
            __ptr = realloc(__ptr,(long)iVar12 * 8);
            *(void **)(piVar3 + 2) = __ptr;
            memset((void *)((long)*piVar3 * 8 + (long)__ptr),0,((long)iVar12 - (long)*piVar3) * 8);
            *piVar3 = iVar12;
          }
        }
        uVar13 = *(ulong *)((long)__ptr + lVar15 * 8);
        if (uVar13 == 0) {
          if (*(code **)(piVar3 + 8) == (code *)0x0) {
            uVar13 = 0;
          }
          else {
            uVar9 = (**(code **)(piVar3 + 8))(*(undefined8 *)(piVar3 + 4));
            *(undefined8 *)(*(long *)(piVar3 + 2) + lVar15 * 8) = uVar9;
            uVar13 = *(ulong *)(*(long *)(piVar3 + 2) + lVar15 * 8);
          }
        }
        pAVar10 = Abc_NodeBddToMuxes_rec
                            (pDVar6,(DdNode *)(uVar13 & 0xfffffffffffffffe),pNtkNew,psVar7);
        if ((uVar13 & 1) != 0) {
          pAVar10 = Abc_NtkCreateNodeInv(pNtkNew,pAVar10);
        }
        Abc_ObjAddFanin((Abc_Obj_t *)plVar2[8],pAVar10);
        lVar16 = lVar16 + 1;
        pVVar11 = pNtk->vCos;
      } while (lVar16 < pVVar11->nSize);
    }
    st__free_table(psVar7);
    Abc_NtkAttrFree(pNtk,7,0);
    Extra_StopManager(pDVar6);
    Abc_NtkCleanCopy(pNtk);
  }
  iVar5 = Abc_NtkCheck(pNtkNew);
  if (iVar5 != 0) {
    return pNtkNew;
  }
  pcVar14 = "Abc_NtkBddToMuxes: The network check has failed.";
LAB_002e60dd:
  puts(pcVar14);
  Abc_NtkDelete(pNtkNew);
  return (Abc_Ntk_t *)0x0;
}

Assistant:

Abc_Ntk_t * Abc_NtkBddToMuxes( Abc_Ntk_t * pNtk, int fGlobal, int Limit )
{
    Abc_Ntk_t * pNtkNew;
    pNtkNew = Abc_NtkStartFrom( pNtk, ABC_NTK_LOGIC, ABC_FUNC_SOP );
    if ( fGlobal ) 
    {
        if ( !Abc_NtkBddToMuxesPerformGlo( pNtk, pNtkNew, Limit ) )
        {
            Abc_NtkDelete( pNtkNew );
            return NULL;
        }
    }
    else
    {
        Abc_NtkBddToMuxesPerform( pNtk, pNtkNew );
        Abc_NtkFinalize( pNtk, pNtkNew );
    }
    // make sure everything is okay
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        printf( "Abc_NtkBddToMuxes: The network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}